

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
initiatorCreatedBeforeStartTimeFixture::initiatorCreatedBeforeStartTimeFixture
          (initiatorCreatedBeforeStartTimeFixture *this)

{
  UtcTimeOnly *this_00;
  UtcTimeOnly *this_01;
  Session *pSVar1;
  allocator<char> local_744;
  allocator<char> local_743;
  allocator<char> local_742;
  allocator<char> local_741;
  STRING local_740;
  string local_720;
  STRING local_700;
  STRING local_6e0;
  _Any_data local_6c0;
  code *local_6b0;
  code *local_6a8;
  FieldBase local_6a0;
  FieldBase local_648;
  TimeRange sessionTime;
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  anon_unknown.dwarf_334836::TestCallback::TestCallback(&this->super_TestCallback);
  (this->super_TestCallback).super_Responder._vptr_Responder =
       (_func_int **)&PTR__initiatorCreatedBeforeStartTimeFixture_002fe360;
  (this->super_TestCallback).super_NullApplication.super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorCreatedBeforeStartTimeFixture_002fe3b0;
  this->actuallySent = 0;
  this->actuallySentLogon = false;
  *(code **)&this->messageStoreFactory = FIX::SocketServer::accept;
  FIX::UtcTimeStamp::setCurrent(&(this->super_TestCallback).now);
  this_00 = &(this->super_TestCallback).startTime;
  (this->super_TestCallback).startTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_TestCallback).startTime.super_DateTime.field_0xc =
       *(undefined8 *)&(this->super_TestCallback).now.super_DateTime.field_0xc;
  *(undefined4 *)((long)&(this->super_TestCallback).startTime.super_DateTime.m_time + 4) =
       *(undefined4 *)((long)&(this->super_TestCallback).now.super_DateTime.m_time + 4);
  FIX::DateTime::setMillisecond(&this_00->super_DateTime,0);
  FIX::DateTime::operator+=(&this_00->super_DateTime,2);
  this_01 = &(this->super_TestCallback).endTime;
  (this->super_TestCallback).endTime.super_DateTime.m_date = 0;
  *(undefined8 *)&(this->super_TestCallback).endTime.super_DateTime.field_0xc =
       *(undefined8 *)&(this->super_TestCallback).now.super_DateTime.field_0xc;
  *(undefined4 *)((long)&(this->super_TestCallback).endTime.super_DateTime.m_time + 4) =
       *(undefined4 *)((long)&(this->super_TestCallback).now.super_DateTime.m_time + 4);
  FIX::DateTime::setMillisecond(&this_01->super_DateTime,0);
  FIX::DateTime::operator+=(&this_01->super_DateTime,4);
  FIX::TimeRange::TimeRange(&sessionTime,this_00,this_01,-1,-1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"FIX.4.2",&local_741);
  FIX::BeginString::BeginString((BeginString *)&provider,&local_740);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"MJKG",&local_742);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_648,&local_6e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"IZZY",&local_743);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_6a0,&local_700);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"",&local_744);
  FIX::SessionID::SessionID
            (&sessionID,
             (string *)
             &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent,&local_648.m_string,&local_6a0.m_string,&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  FIX::FieldBase::~FieldBase(&local_6a0);
  std::__cxx11::string::~string((string *)&local_700);
  FIX::FieldBase::~FieldBase(&local_648);
  std::__cxx11::string::~string((string *)&local_6e0);
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  std::__cxx11::string::~string((string *)&local_740);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a0,"FIX42",(allocator<char> *)&local_740);
  FIX::TestSettings::pathForSpec((string *)&local_648,(string *)&local_6a0);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_6a0);
  pSVar1 = (Session *)operator_new(0x878);
  local_6c0._8_8_ = 0;
  local_6a8 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:2585:9)>
              ::_M_invoke;
  local_6b0 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:2585:9)>
              ::_M_manager;
  local_6c0._M_unused._M_object = this;
  FIX::Session::Session
            (pSVar1,&local_6c0,&(this->super_TestCallback).super_NullApplication,
             &this->messageStoreFactory,&sessionID,&provider,&sessionTime,0x1e,0);
  this->object = pSVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_6c0);
  FIX::DataDictionaryProvider::~DataDictionaryProvider(&provider);
  FIX::SessionID::~SessionID(&sessionID);
  return;
}

Assistant:

initiatorCreatedBeforeStartTimeFixture()
      : actuallySent(0),
        actuallySentLogon(false) {
    now.setCurrent();
    startTime = now;
    startTime.setMillisecond(0);
    startTime += STARTTIMEFROMNOW;
    endTime = now;
    endTime.setMillisecond(0);
    endTime += ENDTIMEFROMNOW;
    TimeRange sessionTime(startTime, endTime);

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("MJKG"), TargetCompID("IZZY"));

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIX42"));
    object = new Session(
        [this]() { return now; },
        *this,
        messageStoreFactory,
        sessionID,
        provider,
        sessionTime,
        HEARTBTINT,
        0);
  }